

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

bool __thiscall spv::Builder::isSpecConstantOpCode(Builder *this,Op opcode)

{
  Op opcode_local;
  Builder *this_local;
  
  if ((opcode - OpSpecConstantTrue < 5) || (opcode == OpSpecConstantCompositeReplicateEXT)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Builder::isSpecConstantOpCode(Op opcode) const
{
    switch (opcode) {
    case OpSpecConstantTrue:
    case OpSpecConstantFalse:
    case OpSpecConstant:
    case OpSpecConstantComposite:
    case OpSpecConstantOp:
    case OpSpecConstantCompositeReplicateEXT:
        return true;
    default:
        return false;
    }
}